

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O3

void check_op<std::not_equal_to>(void)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  char *__s;
  size_t __n;
  AssertionResult gtest_ar;
  Message local_60;
  char *local_58;
  AssertHelper local_50;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  long local_38;
  
  local_38 = 0;
  do {
    __s = (&PTR_anon_var_dwarf_2fdda_001d39c0)[local_38];
    lVar5 = 0;
    local_58 = __s;
    do {
      sVar3 = strlen(__s);
      pcVar6 = *(char **)((long)&PTR_anon_var_dwarf_2fdda_001d39c0 + lVar5);
      sVar4 = strlen(pcVar6);
      __n = sVar4;
      if (sVar3 < sVar4) {
        __n = sVar3;
      }
      if (__n == 0) {
        local_60.ss_.ptr_._0_1_ = sVar3 != sVar4;
LAB_00120a4f:
        local_50.data_._0_1_ = sVar3 != sVar4;
      }
      else {
        iVar2 = bcmp(__s,pcVar6,__n);
        local_60.ss_.ptr_._0_1_ = iVar2 != 0 || sVar3 != sVar4;
        iVar2 = bcmp(local_58,pcVar6,__n);
        local_50.data_._0_1_ = true;
        if (iVar2 == 0) goto LAB_00120a4f;
      }
      testing::internal::CmpHelperEQ<bool,bool>
                (local_48,"Op<int>()(lhs.compare(rhs), 0)","Op<string_view>()(lhs, rhs)",
                 (bool *)&local_60,(bool *)&local_50);
      __s = local_58;
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message(&local_60);
        pcVar6 = "";
        if (local_40.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = ((local_40.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
                   ,0x1aa,pcVar6);
        testing::internal::AssertHelper::operator=(&local_50,&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (((CONCAT71(local_60.ss_.ptr_._1_7_,local_60.ss_.ptr_._0_1_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT71(local_60.ss_.ptr_._1_7_,local_60.ss_.ptr_._0_1_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_60.ss_.ptr_._1_7_,local_60.ss_.ptr_._0_1_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x18);
    local_38 = local_38 + 1;
    if (local_38 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void check_op() {
  const char *inputs[] = {"foo", "fop", "fo"};
  std::size_t num_inputs = sizeof(inputs) / sizeof(*inputs);
  for (std::size_t i = 0; i < num_inputs; ++i) {
    for (std::size_t j = 0; j < num_inputs; ++j) {
      string_view lhs(inputs[i]), rhs(inputs[j]);
      EXPECT_EQ(Op<int>()(lhs.compare(rhs), 0), Op<string_view>()(lhs, rhs));
    }
  }
}